

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

void __thiscall
CVmFormatter::write_text
          (CVmFormatter *this,wchar_t *txt,size_t cnt,vmcon_color_t *colors,vm_nl_type nl)

{
  wchar_t wVar1;
  script_stack_entry *psVar2;
  wchar_t wVar3;
  os_color_t oVar4;
  undefined4 uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  char *pcVar9;
  CCharmapToLocal *pCVar10;
  char *dst;
  size_t rem;
  char local_buf [128];
  undefined1 *local_d0;
  ulong local_c8;
  vm_nl_type local_bc;
  undefined1 local_b8 [136];
  
  psVar2 = this->console_->script_sp_;
  if (((psVar2 == (script_stack_entry *)0x0) || (psVar2->quiet == 0)) ||
     ((this->field_0xf038 & 1) == 0)) {
    iVar7 = (*this->_vptr_CVmFormatter[0xd])(this);
    if (((iVar7 != 0) && (iVar7 = (*this->console_->_vptr_CVmConsole[5])(), iVar7 != 0)) &&
       ((this->is_continuation_ == 0 &&
        (iVar7 = this->linecnt_, iVar8 = (*this->console_->_vptr_CVmConsole[8])(),
        iVar8 <= iVar7 + 1)))) {
      (*this->_vptr_CVmFormatter[5])(this,0x2000000,0x3000000);
      (*this->_vptr_CVmFormatter[7])(this,0);
      (*this->console_->_vptr_CVmConsole[9])();
      (*this->_vptr_CVmFormatter[5])(this,(this->os_color_).fg,(this->os_color_).bg);
      (*this->_vptr_CVmFormatter[7])(this,(ulong)(uint)(this->os_color_).attr);
    }
    if ((nl & ~VM_NL_NONE_INTERNAL) != VM_NL_NONE) {
      this->linecnt_ = this->linecnt_ + 1;
    }
    local_d0 = local_b8;
    local_c8 = 0x7f;
    if (cnt != 0) {
      local_bc = nl;
      do {
        if ((colors != (vmcon_color_t *)0x0) &&
           (((colors->fg != (this->os_color_).fg || (colors->bg != (this->os_color_).bg)) ||
            (colors->attr != (this->os_color_).attr)))) {
          *local_d0 = 0;
          (*this->_vptr_CVmFormatter[8])(this,local_b8);
          local_c8 = 0x7f;
          local_d0 = local_b8;
          if (colors->attr != (this->os_color_).attr) {
            (*this->_vptr_CVmFormatter[7])(this);
          }
          if ((colors->fg != (this->os_color_).fg) || (colors->bg != (this->os_color_).bg)) {
            (*this->_vptr_CVmFormatter[5])(this);
          }
          uVar5 = *(undefined4 *)&colors->field_0x14;
          (this->os_color_).attr = colors->attr;
          *(undefined4 *)&(this->os_color_).field_0x14 = uVar5;
          oVar4 = colors->bg;
          (this->os_color_).fg = colors->fg;
          (this->os_color_).bg = oVar4;
        }
        uVar6 = local_c8;
        wVar1 = *txt;
        wVar3 = wVar1;
        if (wVar1 == L'\xa0') {
          wVar3 = L' ';
        }
        if ((*(ushort *)&this->field_0xef81 & 0x40) != 0) {
          wVar3 = wVar1;
        }
        pCVar10 = this->cmap_;
        if (this->cmap_ == (CCharmapToLocal *)0x0) {
          pCVar10 = G_cmap_to_ui_X;
        }
        iVar7 = (*(pCVar10->super_CCharmap)._vptr_CCharmap[2])
                          (pCVar10,(ulong)(uint)wVar3,&local_d0,&local_c8);
        if (uVar6 < CONCAT44(extraout_var,iVar7)) {
          *local_d0 = 0;
          (*this->_vptr_CVmFormatter[8])(this,local_b8);
          local_c8 = 0x7f;
          local_d0 = local_b8;
        }
        else {
          txt = txt + 1;
          cnt = cnt - 1;
          if (colors != (vmcon_color_t *)0x0) {
            colors = colors + 1;
          }
        }
        nl = local_bc;
      } while (cnt != 0);
      if (local_b8 < local_d0) {
        *local_d0 = 0;
        (*this->_vptr_CVmFormatter[8])(this,local_b8);
      }
    }
    if (nl == VM_NL_OSNEWLINE) {
      pcVar9 = " ";
    }
    else {
      if (nl != VM_NL_NEWLINE) {
        return;
      }
      pcVar9 = "<BR HEIGHT=0>\n";
      if (this->html_pre_level_ != 0) {
        pcVar9 = "\n";
      }
      if ((this->field_0xef81 & 0x40) == 0) {
        pcVar9 = "\n";
      }
    }
    (*this->_vptr_CVmFormatter[8])(this,pcVar9);
  }
  return;
}

Assistant:

void CVmFormatter::write_text(VMG_ const wchar_t *txt, size_t cnt,
                              const vmcon_color_t *colors, vm_nl_type nl)
{
    /* 
     *   Check the "script quiet" mode - this indicates that we're reading
     *   a script and not echoing output to the display.  If this mode is
     *   on, and we're writing to the display, suppress this write.  If
     *   the mode is off, or we're writing to a non-display stream (such
     *   as a log file stream), show the output as normal.  
     */
    if (!console_->is_quiet_script() || !is_disp_stream_)
    {
        char local_buf[128];
        char *dst;
        size_t rem;

        /*
         *   Check to see if we've reached the end of the screen, and if so
         *   run the MORE prompt.  Note that we don't show a MORE prompt
         *   unless we're in "formatter more mode," since if we're not, then
         *   the OS layer code is taking responsibility for pagination
         *   issues.
         *   
         *   Note that we suppress the MORE prompt if we're showing a
         *   continuation of a line already partially shown.  We only want to
         *   show a MORE prompt at the start of a new line.
         *   
         *   Skip the MORE prompt if this stream doesn't use it.  
         */
        if (formatter_more_mode()
            && console_->is_more_mode()
            && !is_continuation_
            && linecnt_ + 1 >= console_->get_page_length())
        {
            /* set the standard text color */
            set_os_text_color(OS_COLOR_P_TEXT, OS_COLOR_P_TEXTBG);
            set_os_text_attr(0);

            /* display the MORE prompt */
            console_->show_more_prompt(vmg0_);

            /* restore the current color scheme */
            set_os_text_color(os_color_.fg, os_color_.bg);
            set_os_text_attr(os_color_.attr);
        }

        /* count the line if a newline follows */
        if (nl != VM_NL_NONE && nl != VM_NL_NONE_INTERNAL)
            ++linecnt_;

        /* convert and display the text */
        for (dst = local_buf, rem = sizeof(local_buf) - 1 ; cnt != 0 ; )
        {
            size_t cur;
            size_t old_rem;
            wchar_t c;
            
            /* 
             *   if this character is in a new color, write out the OS-level
             *   color switch code 
             */
            if (colors != 0 && !colors->equals(&os_color_))
            {
                /* 
                 *   null-terminate and display what's in the buffer so far,
                 *   so that we close out all of the remaining text in the
                 *   old color and attributes
                 */
                *dst = '\0';
                print_to_os(local_buf);

                /* reset to the start of the local output buffer */
                dst = local_buf;
                rem = sizeof(local_buf) - 1;

                /* set the text attributes, if they changed */
                if (colors->attr != os_color_.attr)
                    set_os_text_attr(colors->attr);

                /* set the color, if it changed */
                if (colors->fg != os_color_.fg
                    || colors->bg != os_color_.bg)
                    set_os_text_color(colors->fg, colors->bg);

                /* 
                 *   Whatever happened, set our new color internally as the
                 *   last color we sent to the OS.  Even if we didn't
                 *   actually do anything, we'll at least know we won't have
                 *   to do anything more until we find another new color. 
                 */
                os_color_ = *colors;
            }

            /* get this character */
            c = *txt;

            /* 
             *   translate non-breaking spaces into ordinary spaces if the
             *   underlying target isn't HTML-based 
             */
            if (!html_target_ && c == 0x00A0)
                c = ' ';

            /* try storing another character */
            old_rem = rem;
            cur = (cmap_ != 0 ? cmap_ : G_cmap_to_ui)->map(c, &dst, &rem);

            /* if that failed, flush the buffer and try again */
            if (cur > old_rem)
            {
                /* null-terminate the buffer */
                *dst = '\0';
                
                /* display the text */
                print_to_os(local_buf);

                /* reset to the start of the local output buffer */
                dst = local_buf;
                rem = sizeof(local_buf) - 1;
            }
            else
            {
                /* we've now consumed this character of input */
                ++txt;
                --cnt;
                if (colors != 0)
                    ++colors;
            }
        }

        /* if we have a partially-filled buffer, display it */
        if (dst > local_buf)
        {
            /* null-terminate and display the buffer */
            *dst = '\0';
            print_to_os(local_buf);
        }

        /* write the appropriate type of line termination */
        switch(nl)
        {
        case VM_NL_NONE:
        case VM_NL_INPUT:
        case VM_NL_NONE_INTERNAL:
            /* no line termination is needed */
            break;

        case VM_NL_NEWLINE:
            /* write a newline */
            print_to_os(html_target_ && html_pre_level_ == 0 ?
                        "<BR HEIGHT=0>\n" : "\n");
            break;

        case VM_NL_OSNEWLINE:
            /* 
             *   the OS will provide a newline, but add a space to make it
             *   explicit that we can break the line here 
             */
            print_to_os(" ");
            break;
        }
    }
}